

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  char cVar1;
  basic_format_specs<char> *specs;
  size_t sVar2;
  size_t __n;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  ulong uVar8;
  char *it;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int num_digits;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ptrdiff_t _Num;
  string_view prefix;
  undefined1 auVar16 [16];
  buffer<char> *c;
  string groups;
  write_int_data<char> data;
  undefined7 in_stack_ffffffffffffff28;
  buffer<char> *file;
  string local_b8;
  write_int_data<char> local_98;
  char *local_88;
  ulong local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong local_68;
  ulong local_60;
  int local_58;
  string *local_50;
  char local_48;
  
  grouping_impl<char>(&local_b8,(locale_ref)(this->locale).locale_);
  if (local_b8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar3 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar3 == '\0') {
      on_dec(this);
    }
    else {
      uVar13 = (ulong)this->abs_value;
      uVar8 = *(ulong *)((long)&this->abs_value + 8);
      auVar16 = (undefined1  [16])this->abs_value;
      iVar14 = 1;
      if ((uVar13 < 10) <= uVar8) {
        iVar15 = 4;
        do {
          iVar14 = iVar15;
          uVar4 = auVar16._8_8_;
          uVar11 = auVar16._0_8_;
          if (uVar4 == 0 && (ulong)(99 < uVar11) <= -uVar4) {
            iVar14 = iVar14 + -2;
            goto LAB_0010ae48;
          }
          if (uVar4 == 0 && (ulong)(999 < uVar11) <= -uVar4) {
            iVar14 = iVar14 + -1;
            goto LAB_0010ae48;
          }
          if (uVar4 < (uVar11 < 10000)) goto LAB_0010ae48;
          auVar16 = __udivti3(uVar11,uVar4,10000,0);
          iVar15 = iVar14 + 4;
        } while (uVar4 != 0 || -uVar4 < (ulong)(99999 < uVar11));
        iVar14 = iVar14 + 1;
      }
LAB_0010ae48:
      pcVar5 = local_b8._M_dataplus._M_p + local_b8._M_string_length;
      _Var7._M_p = local_b8._M_dataplus._M_p;
      iVar15 = iVar14;
      num_digits = iVar14;
      if (local_b8._M_string_length != 0) {
        iVar9 = iVar14 + (int)local_b8._M_string_length;
        _Var6._M_p = local_b8._M_dataplus._M_p;
        do {
          cVar1 = *_Var6._M_p;
          iVar10 = iVar15 - cVar1;
          _Var7._M_p = _Var6._M_p;
          num_digits = iVar14;
          if ((iVar10 == 0 || iVar15 < cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) break;
          iVar14 = iVar14 + 1;
          _Var6._M_p = _Var6._M_p + 1;
          local_b8._M_string_length = local_b8._M_string_length - 1;
          _Var7._M_p = pcVar5;
          iVar15 = iVar10;
          num_digits = iVar9;
        } while (local_b8._M_string_length != 0);
      }
      if (_Var7._M_p == pcVar5) {
        num_digits = num_digits + (iVar15 + -1) / (int)pcVar5[-1];
      }
      file = (this->out).container;
      specs = this->specs;
      pcVar5 = this->prefix;
      uVar12 = (ulong)this->prefix_size;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = pcVar5;
      prefix.size_._4_4_ = 0;
      write_int_data<char>::write_int_data(&local_98,num_digits,prefix,specs);
      uVar11 = CONCAT44(local_98.size._4_4_,(undefined4)local_98.size);
      local_78 = (undefined4)local_98.size;
      uStack_74 = local_98.size._4_4_;
      uStack_70 = (undefined4)local_98.padding;
      uStack_6c = local_98.padding._4_4_;
      local_50 = &local_b8;
      uVar4 = (ulong)specs->width;
      local_88 = pcVar5;
      local_80 = uVar12;
      local_68 = uVar13;
      local_60 = uVar8;
      local_58 = num_digits;
      local_48 = cVar3;
      if ((long)uVar4 < 0) {
        assert_fail((char *)file,0,(char *)CONCAT17(cVar3,in_stack_ffffffffffffff28));
      }
      uVar13 = 0;
      if (uVar11 <= uVar4) {
        uVar13 = uVar4 - uVar11;
      }
      uVar4 = uVar13 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                  (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      sVar2 = file->size_;
      uVar8 = uVar11 + sVar2 + (specs->fill).size_ * uVar13;
      if (file->capacity_ < uVar8) {
        (**file->_vptr_buffer)(file,uVar8);
      }
      file->size_ = uVar8;
      pcVar5 = fill<char*,char>(file->ptr_ + sVar2,uVar4,&specs->fill);
      uVar8 = local_80;
      if (local_80 != 0) {
        memmove(pcVar5,local_88,local_80);
        pcVar5 = pcVar5 + uVar8;
      }
      __n = CONCAT44(uStack_6c,uStack_70);
      it = pcVar5;
      if (__n != 0) {
        it = pcVar5 + __n;
        memset(pcVar5,0x30,__n);
      }
      pcVar5 = int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>
               ::num_writer::operator()((num_writer *)&local_68,it);
      fill<char*,char>(pcVar5,uVar13 - uVar4,&specs->fill);
      (this->out).container = file;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && num_digits > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      num_digits -= *group;
      ++group;
    }
    if (group == groups.cend())
      size += sep_size * ((num_digits - 1) / groups.back());
    out = write_int(out, size, get_prefix(), specs,
                    num_writer{abs_value, size, groups, sep});
  }